

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

size_t json_object_get_cell_ix
                 (JSON_Object *object,char *key,size_t key_len,unsigned_long hash,
                 parson_bool_t *out_found)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t key_to_check_len;
  char *key_to_check;
  unsigned_long hash_to_check;
  uint i;
  size_t ix;
  size_t cell;
  size_t cell_ix;
  parson_bool_t *out_found_local;
  unsigned_long hash_local;
  size_t key_len_local;
  char *key_local;
  JSON_Object *object_local;
  
  sVar1 = object->cell_capacity;
  *out_found = 0;
  hash_to_check._4_4_ = 0;
  while( true ) {
    if (object->cell_capacity <= (ulong)hash_to_check._4_4_) {
      return 0xffffffffffffffff;
    }
    uVar4 = (hash & sVar1 - 1) + (ulong)hash_to_check._4_4_ & object->cell_capacity - 1;
    sVar2 = object->cells[uVar4];
    if (sVar2 == 0xffffffffffffffff) break;
    if (hash == object->hashes[sVar2]) {
      __s = object->names[sVar2];
      sVar5 = strlen(__s);
      if ((sVar5 == key_len) && (iVar3 = strncmp(key,__s,key_len), iVar3 == 0)) {
        *out_found = 1;
        return uVar4;
      }
    }
    hash_to_check._4_4_ = hash_to_check._4_4_ + 1;
  }
  return uVar4;
}

Assistant:

static size_t json_object_get_cell_ix(const JSON_Object *object, const char *key, size_t key_len, unsigned long hash, parson_bool_t *out_found) {
    size_t cell_ix = hash & (object->cell_capacity - 1);
    size_t cell = 0;
    size_t ix = 0;
    unsigned int i = 0;
    unsigned long hash_to_check = 0;
    const char *key_to_check = NULL;
    size_t key_to_check_len = 0;

    *out_found = PARSON_FALSE;

    for (i = 0; i < object->cell_capacity; i++) {
        ix = (cell_ix + i) & (object->cell_capacity - 1);
        cell = object->cells[ix];
        if (cell == OBJECT_INVALID_IX) {
            return ix;
        }
        hash_to_check = object->hashes[cell];
        if (hash != hash_to_check) {
            continue;
        }
        key_to_check = object->names[cell];
        key_to_check_len = strlen(key_to_check);
        if (key_to_check_len == key_len && strncmp(key, key_to_check, key_len) == 0) {
            *out_found = PARSON_TRUE;
            return ix;
        }
    }
    return OBJECT_INVALID_IX;
}